

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

bool __thiscall QTreeView::isIndexHidden(QTreeView *this,QModelIndex *index)

{
  int row;
  QAbstractItemModel *pQVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QModelIndex local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHeaderView::isSectionHidden
                    (*(QHeaderView **)
                      (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                 super_QFrame.super_QWidget.field_0x8 + 0x590),index->c);
  bVar3 = true;
  if (!bVar2) {
    row = index->r;
    pQVar1 = (index->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_38.r = -1;
      local_38.c = -1;
      local_38.i = 0;
      local_38.m.ptr = (QAbstractItemModel *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x68))(&local_38,pQVar1,index);
    }
    bVar3 = isRowHidden(this,row,&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeView::isIndexHidden(const QModelIndex &index) const
{
    return (isColumnHidden(index.column()) || isRowHidden(index.row(), index.parent()));
}